

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.cpp
# Opt level: O1

void __thiscall
duckdb::DynamicTableFilterSet::ClearFilters(DynamicTableFilterSet *this,PhysicalOperator *op)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    ::std::
    _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&(this->filters)._M_h);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void DynamicTableFilterSet::ClearFilters(const PhysicalOperator &op) {
	lock_guard<mutex> l(lock);
	filters.erase(op);
}